

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O0

Aig_Man_t * Dar_ManRwsat(Aig_Man_t *pAig,int fBalance,int fVerbose)

{
  Aig_Man_t *pAVar1;
  abctime aVar2;
  Aig_Man_t *p;
  Dar_RefPar_t *pParsRef;
  Dar_RefPar_t ParsRef;
  Dar_RwrPar_t *pParsRwr;
  Dar_RwrPar_t ParsRwr;
  abctime Time;
  Aig_Man_t *pTemp;
  int fVerbose_local;
  int fBalance_local;
  Aig_Man_t *pAig_local;
  
  ParsRwr._28_8_ = pAig->Time2Quit;
  ParsRef._24_8_ = (long)&pParsRwr + 4;
  Dar_ManDefaultRwrParams((Dar_RwrPar_t *)ParsRef._24_8_);
  Dar_ManDefaultRefParams((Dar_RefPar_t *)&pParsRef);
  *(undefined4 *)(ParsRef._24_8_ + 0xc) = 0;
  ParsRef.nCutsMax = 0;
  *(int *)(ParsRef._24_8_ + 0x1c) = fVerbose;
  ParsRef.fUpdateLevel = fVerbose;
  pAVar1 = Aig_ManDupDfs(pAig);
  if (fVerbose != 0) {
    printf("Starting:  ");
    Aig_ManPrintStats(pAVar1);
  }
  _fVerbose_local = pAVar1;
  if (fBalance != 0) {
    pAVar1->Time2Quit = ParsRwr._28_8_;
    _fVerbose_local = Dar_ManBalance(pAVar1,0);
    Aig_ManStop(pAVar1);
    if (fVerbose != 0) {
      printf("Balance:   ");
      Aig_ManPrintStats(_fVerbose_local);
    }
    if ((ParsRwr._28_8_ != 0) && (aVar2 = Abc_Clock(), (long)ParsRwr._28_8_ < aVar2)) {
      if (_fVerbose_local != (Aig_Man_t *)0x0) {
        Aig_ManStop(_fVerbose_local);
      }
      return (Aig_Man_t *)0x0;
    }
  }
  _fVerbose_local->Time2Quit = ParsRwr._28_8_;
  Dar_ManRewrite(_fVerbose_local,(Dar_RwrPar_t *)ParsRef._24_8_);
  pAVar1 = Aig_ManDupDfs(_fVerbose_local);
  Aig_ManStop(_fVerbose_local);
  if (fVerbose != 0) {
    printf("Rewrite:   ");
    Aig_ManPrintStats(pAVar1);
  }
  if ((ParsRwr._28_8_ == 0) || (aVar2 = Abc_Clock(), aVar2 <= (long)ParsRwr._28_8_)) {
    pAVar1->Time2Quit = ParsRwr._28_8_;
    Dar_ManRefactor(pAVar1,(Dar_RefPar_t *)&pParsRef);
    p = Aig_ManDupDfs(pAVar1);
    Aig_ManStop(pAVar1);
    if (fVerbose != 0) {
      printf("Refactor:  ");
      Aig_ManPrintStats(p);
    }
    if ((ParsRwr._28_8_ == 0) || (aVar2 = Abc_Clock(), aVar2 <= (long)ParsRwr._28_8_)) {
      _fVerbose_local = p;
      if (fBalance != 0) {
        p->Time2Quit = ParsRwr._28_8_;
        _fVerbose_local = Dar_ManBalance(p,0);
        Aig_ManStop(p);
        if (fVerbose != 0) {
          printf("Balance:   ");
          Aig_ManPrintStats(_fVerbose_local);
        }
        if ((ParsRwr._28_8_ != 0) && (aVar2 = Abc_Clock(), (long)ParsRwr._28_8_ < aVar2)) {
          if (_fVerbose_local != (Aig_Man_t *)0x0) {
            Aig_ManStop(_fVerbose_local);
          }
          return (Aig_Man_t *)0x0;
        }
      }
      _fVerbose_local->Time2Quit = ParsRwr._28_8_;
      Dar_ManRewrite(_fVerbose_local,(Dar_RwrPar_t *)ParsRef._24_8_);
      pAig_local = Aig_ManDupDfs(_fVerbose_local);
      Aig_ManStop(_fVerbose_local);
      if (fVerbose != 0) {
        printf("Rewrite:   ");
        Aig_ManPrintStats(pAig_local);
      }
      if ((ParsRwr._28_8_ != 0) && (aVar2 = Abc_Clock(), (long)ParsRwr._28_8_ < aVar2)) {
        if (pAig_local != (Aig_Man_t *)0x0) {
          Aig_ManStop(pAig_local);
        }
        pAig_local = (Aig_Man_t *)0x0;
      }
    }
    else {
      if (p != (Aig_Man_t *)0x0) {
        Aig_ManStop(p);
      }
      pAig_local = (Aig_Man_t *)0x0;
    }
  }
  else {
    if (pAVar1 != (Aig_Man_t *)0x0) {
      Aig_ManStop(pAVar1);
    }
    pAig_local = (Aig_Man_t *)0x0;
  }
  return pAig_local;
}

Assistant:

Aig_Man_t * Dar_ManRwsat( Aig_Man_t * pAig, int fBalance, int fVerbose )
//alias rwsat       "st; rw -l; b -l; rw -l; rf -l"
{
    Aig_Man_t * pTemp;
    abctime Time = pAig->Time2Quit;

    Dar_RwrPar_t ParsRwr, * pParsRwr = &ParsRwr;
    Dar_RefPar_t ParsRef, * pParsRef = &ParsRef;

    Dar_ManDefaultRwrParams( pParsRwr );
    Dar_ManDefaultRefParams( pParsRef );

    pParsRwr->fUpdateLevel = 0;
    pParsRef->fUpdateLevel = 0;

    pParsRwr->fVerbose = fVerbose;
    pParsRef->fVerbose = fVerbose;
//printf( "1" );
    pAig = Aig_ManDupDfs( pAig ); 
    if ( fVerbose ) printf( "Starting:  " ), Aig_ManPrintStats( pAig );

//printf( "2" );
    // balance
    if ( fBalance )
    {
    pAig->Time2Quit = Time;
    pAig = Dar_ManBalance( pTemp = pAig, 0 );
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Balance:   " ), Aig_ManPrintStats( pAig );
    if ( Time && Abc_Clock() > Time )
        { if ( pAig ) Aig_ManStop( pAig ); return NULL; }
    }
   
//Aig_ManDumpBlif( pAig, "inter.blif", NULL, NULL );
//printf( "3" );
    // rewrite
    pAig->Time2Quit = Time;
    Dar_ManRewrite( pAig, pParsRwr );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Rewrite:   " ), Aig_ManPrintStats( pAig );
    if ( Time && Abc_Clock() > Time )
        { if ( pAig ) Aig_ManStop( pAig ); return NULL; }

//printf( "4" );
    // refactor
    pAig->Time2Quit = Time;
    Dar_ManRefactor( pAig, pParsRef );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Refactor:  " ), Aig_ManPrintStats( pAig );
    if ( Time && Abc_Clock() > Time )
        { if ( pAig ) Aig_ManStop( pAig ); return NULL; }

//printf( "5" );
    // balance
    if ( fBalance )
    {
    pAig->Time2Quit = Time;
    pAig = Dar_ManBalance( pTemp = pAig, 0 );
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Balance:   " ), Aig_ManPrintStats( pAig );
    if ( Time && Abc_Clock() > Time )
        { if ( pAig ) Aig_ManStop( pAig ); return NULL; }
    }

//printf( "6" );
    // rewrite
    pAig->Time2Quit = Time;
    Dar_ManRewrite( pAig, pParsRwr );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Rewrite:   " ), Aig_ManPrintStats( pAig );
    if ( Time && Abc_Clock() > Time )
        { if ( pAig ) Aig_ManStop( pAig ); return NULL; }

//printf( "7" );
    return pAig;
}